

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O2

void compute_padded_integral_img_int(uint8_t *gray_image,integral_image *iimage)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  long lVar10;
  uint8_t *puVar11;
  long lVar12;
  long lVar13;
  int i;
  float fVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int i_2;
  ulong uVar20;
  float *pfVar21;
  ulong uVar22;
  undefined1 in_XMM2 [16];
  
  uVar1 = iimage->data_width;
  lVar7 = (long)(int)uVar1;
  uVar2 = iimage->width;
  pfVar6 = iimage->padded_data;
  lVar12 = (long)iimage->data_height;
  uVar3 = iimage->height;
  uVar5 = (int)(uVar1 - uVar2) / 2;
  uVar22 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
  pfVar8 = pfVar6;
  for (uVar20 = 0; uVar20 != uVar22; uVar20 = uVar20 + 1) {
    for (uVar16 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar16; uVar16 = uVar16 + 1) {
      pfVar8[uVar16] = 0.0;
    }
    pfVar8 = pfVar8 + lVar7;
  }
  lVar17 = (long)(int)uVar5;
  pfVar8 = pfVar6 + lVar7 * lVar17;
  for (lVar19 = lVar17; lVar19 < lVar12; lVar19 = lVar19 + 1) {
    for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
      pfVar8[uVar20] = 0.0;
    }
    pfVar8 = pfVar8 + lVar7;
  }
  pfVar8 = iimage->data;
  uVar22 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
  fVar14 = 0.0;
  for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
    fVar14 = (float)((int)fVar14 + (uint)gray_image[uVar20]);
    pfVar8[uVar20] = fVar14;
  }
  puVar11 = gray_image + (int)uVar2;
  pfVar9 = pfVar8;
  pfVar21 = pfVar8;
  for (lVar19 = 1; pfVar21 = pfVar21 + lVar7, lVar19 < (int)uVar3; lVar19 = lVar19 + 1) {
    iVar15 = 0;
    for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
      iVar15 = iVar15 + (uint)puVar11[uVar20];
      pfVar21[uVar20] = (float)((int)pfVar9[uVar20] + iVar15);
    }
    pfVar9 = pfVar9 + lVar7;
    puVar11 = puVar11 + (int)uVar2;
  }
  for (uVar20 = 0; uVar20 != (~((int)uVar3 >> 0x1f) & uVar3); uVar20 = uVar20 + 1) {
    for (uVar16 = 0; uVar22 != uVar16; uVar16 = uVar16 + 1) {
      auVar4 = vcvtusi2ss_avx512f(in_XMM2,pfVar8[uVar16]);
      pfVar8[uVar16] = auVar4._0_4_ * 0.003921569;
    }
    pfVar8 = pfVar8 + lVar7;
  }
  iVar15 = uVar5 + uVar2;
  lVar13 = (int)uVar3 + lVar17;
  lVar10 = (long)iVar15;
  pfVar8 = pfVar6 + lVar7 * lVar17;
  for (lVar19 = lVar17; lVar19 < lVar13; lVar19 = lVar19 + 1) {
    fVar14 = pfVar6[(long)(int)((int)lVar19 * uVar1 + iVar15) + -1];
    for (lVar18 = lVar10; lVar18 < lVar7; lVar18 = lVar18 + 1) {
      pfVar8[lVar18] = fVar14;
    }
    pfVar8 = pfVar8 + lVar7;
  }
  pfVar8 = pfVar6 + lVar7 * lVar13;
  pfVar21 = pfVar6 + (lVar13 + -1) * lVar7;
  for (lVar19 = lVar13; lVar18 = lVar17, lVar19 < lVar12; lVar19 = lVar19 + 1) {
    for (; lVar18 < lVar10; lVar18 = lVar18 + 1) {
      pfVar8[lVar18] = pfVar21[lVar18];
    }
    pfVar8 = pfVar8 + lVar7;
    pfVar21 = pfVar21 + lVar7;
  }
  fVar14 = pfVar6[(long)(int)(iVar15 + ((int)lVar13 + -1) * uVar1) + -1];
  pfVar6 = pfVar6 + lVar7 * lVar13;
  for (; lVar19 = lVar10, lVar13 < lVar12; lVar13 = lVar13 + 1) {
    for (; lVar19 < lVar7; lVar19 = lVar19 + 1) {
      pfVar6[lVar19] = fVar14;
    }
    pfVar6 = pfVar6 + lVar7;
  }
  return;
}

Assistant:

void compute_padded_integral_img_int(uint8_t *gray_image, struct integral_image *iimage) {

    float *iimage_padded_data = iimage->padded_data;
   
    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        for (int i = 0; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        for (int i = 0; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        uint32_t *iimage_idata = (uint32_t *) iimage->data;

        uint32_t row_sum = 0;

        /* sum up the first row */
        for (int i = 0; i < width; ++i) {
            /* previous rows are 0 */
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }

        /* sum all remaining rows*/
        for (int j = 1; j < height; ++j) {
            row_sum = 0;
            for (int i = 0; i < width; ++i) {
                row_sum += gray_image[j * width + i];
                /*add sum of current row until current idx to sum of all previous rows until current index */
                iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j - 1) * data_width + i];
            }
        }

        // Converting uint32_t to floats by casting them and multiplying with (1.0f/255.0f)
        float *iimage_data = iimage->data;
        for (int j = 0; j < height; ++j) {
            for (int i = 0; i < width; ++i) {
                //iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
                iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
                //iimage_data[j * data_width + i] = ((float) iimage_idata[j * data_width + i]) / 255.0f;
            }
        }
    
    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row = iimage_padded_data[j * data_width + border + width - 1]; // TODO: Check if this is correct
        for (int i = width + border; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row;
        }
    }

    // BLOCK D
    for (int j = border + height; j < data_height; ++j) {
        for (int i = border; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value = iimage_padded_data[index_last_element];
    for (int j = border + height; j < data_height; ++j) {
        for (int i = border + width; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value;
        }
    }

}